

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

Expression * __thiscall
wasm::OptimizeInstructions::optimizeRelational(OptimizeInstructions *this,Binary *curr)

{
  Id IVar1;
  BinaryOp BVar2;
  Binary *pBVar3;
  Type TVar4;
  Expression *pEVar5;
  bool bVar6;
  bool bVar7;
  BinaryOp BVar8;
  Index IVar9;
  uint uVar10;
  uint uVar11;
  Binary *pBVar12;
  undefined4 extraout_var;
  int64_t iVar13;
  Binary *pBVar14;
  Binary *leftConst;
  Binary *right;
  Binary *rightConst;
  Literal *__return_storage_ptr__;
  Literal local_228;
  Literal local_210;
  Literal local_1f8;
  Literal local_1e0;
  undefined1 local_1c8 [8];
  Binary *add;
  undefined1 local_1b8 [8];
  Literal C1;
  undefined1 local_170 [8];
  Literal C1SubC2;
  SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  local_150;
  undefined1 local_138 [8];
  Literal C2;
  anon_union_16_6_1532cd5a_for_Literal_0 local_f0;
  anon_union_16_6_1532cd5a_for_Literal_0 local_d8;
  undefined1 local_c0 [8];
  Literal C2SubC1;
  undefined1 local_90 [8];
  Literal zero;
  long local_68;
  Const *c2;
  OptimizeInstructions *local_48;
  HeapType local_40;
  Binary *inner;
  
  pBVar14 = (Binary *)curr->left;
  if (((pBVar14->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id &
      0xfffffffffffffffe) != 2) {
    return (Expression *)0x0;
  }
  pBVar3 = (Binary *)curr->right;
  TVar4.id = (pBVar3->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id;
  local_48 = this;
  if (6 < TVar4.id) {
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x1c4,"BasicType wasm::Type::getBasic() const");
  }
  BVar2 = curr->op;
  pBVar12 = (Binary *)(ulong)BVar2;
  if ((BVar2 == *(BinaryOp *)(&DAT_00e163e4 + TVar4.id * 4)) ||
     (BVar2 == *(BinaryOp *)(&DAT_00e163c8 + TVar4.id * 4))) {
    bVar6 = true;
    if (((pBVar14->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id ==
         BinaryId) &&
       ((pBVar12 = (Binary *)(ulong)pBVar14->op,
        pBVar14->op == *(BinaryOp *)(&DAT_00e1658c + TVar4.id * 4) &&
        (leftConst = (Binary *)pBVar14->right,
        (((SpecificExpression<(wasm::Expression::Id)14> *)
         &leftConst->super_SpecificExpression<(wasm::Expression::Id)16>)->super_Expression)._id ==
        ConstId)))) {
      IVar1 = (pBVar3->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id;
      pBVar12 = (Binary *)(ulong)IVar1;
      if (IVar1 == BinaryId) {
        BVar2 = pBVar3->op;
        inner = leftConst;
        BVar8 = Abstract::getBinary(TVar4,Add);
        pBVar12 = (Binary *)CONCAT44(extraout_var,BVar8);
        if (BVar2 == BVar8) {
          rightConst = (Binary *)pBVar3->right;
          bVar7 = (rightConst->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.
                  _id == ConstId;
          bVar6 = !bVar7;
          leftConst = inner;
          right = pBVar3;
          if (bVar7) goto LAB_009eb0cf;
        }
      }
      else if (IVar1 == ConstId) {
        bVar6 = false;
        right = (Binary *)0x0;
        rightConst = pBVar3;
LAB_009eb0cf:
        pBVar12 = (Binary *)
                  combineRelationalConstants
                            (local_48,curr,pBVar14,(Const *)leftConst,right,(Const *)rightConst);
      }
    }
    if (!bVar6) {
      return (Expression *)pBVar12;
    }
  }
  C1SubC2.field_0.func.super_IString.str._M_str = local_c0;
  local_c0 = (undefined1  [8])0x0;
  C1SubC2.type.id = (uintptr_t)local_90;
  local_90 = (undefined1  [8])0x0;
  local_170 = (undefined1  [8])&local_40;
  C1SubC2.field_0.i32 = 4;
  C2.type.id = (uintptr_t)local_1b8;
  C1.field_0.func.super_IString.str._M_str = (char *)0x0;
  local_1b8 = (undefined1  [8])0x0;
  local_138 = (undefined1  [8])0x0;
  C2.field_0.i32 = 0x1b;
  inner = pBVar12;
  if ((((curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id == BinaryId)
      && (BVar2 = curr->op, C2.field_0.func.super_IString.str._M_str = local_170,
         BVar8 = Abstract::getBinary((Type)(curr->left->type).id,GtU), BVar2 == BVar8)) &&
     (bVar6 = Match::Internal::
              Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
              ::match(curr,(SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                            *)&C2.field_0.func.super_IString.str._M_str), bVar6)) {
    curr->op = *(BinaryOp *)(&DAT_00e163c8 + TVar4.id * 4);
    pEVar5 = *(Expression **)(local_40.id + 0x20);
    curr->left = *(Expression **)(local_40.id + 0x18);
    curr->right = pEVar5;
    bVar6 = false;
    inner = curr;
    goto LAB_009eb428;
  }
  local_170 = (undefined1  [8])&local_40;
  local_c0 = (undefined1  [8])0x0;
  local_90 = (undefined1  [8])0x0;
  C1SubC2.field_0.i32 = 4;
  C1SubC2.field_0.func.super_IString.str._M_str = local_c0;
  C1SubC2.type.id = (uintptr_t)local_90;
  C1.field_0.func.super_IString.str._M_str = (char *)0x0;
  local_1b8 = (undefined1  [8])0x0;
  local_138 = (undefined1  [8])0x0;
  C2.field_0.i32 = 0x19;
  if ((((curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id == BinaryId)
      && (BVar2 = curr->op, C2.field_0.func.super_IString.str._M_str = local_170,
         C2.type.id = (uintptr_t)local_1b8,
         BVar8 = Abstract::getBinary((Type)(curr->left->type).id,LeU), BVar2 == BVar8)) &&
     (bVar6 = Match::Internal::
              Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
              ::match(curr,(SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                            *)&C2.field_0.func.super_IString.str._M_str), bVar6)) {
    curr->op = *(BinaryOp *)(&DAT_00e163e4 + TVar4.id * 4);
LAB_009eb40f:
    pEVar5 = *(Expression **)(local_40.id + 0x20);
    curr->left = *(Expression **)(local_40.id + 0x18);
    curr->right = pEVar5;
    bVar6 = false;
    inner = curr;
  }
  else {
    local_c0 = (undefined1  [8])&local_40;
    C2SubC1.field_0.func.super_IString.str._M_str = (char *)&c2;
    c2 = (Const *)0x0;
    C2SubC1.type.id = (uintptr_t)&local_f0;
    local_f0.i64 = 0;
    C2SubC1.field_0.i32 = 4;
    C1.field_0.func.super_IString.str._M_str = (char *)0x0;
    local_1b8 = (undefined1  [8])0x0;
    local_138 = (undefined1  [8])0x0;
    C2.field_0.i32 = 0x14;
    C2.field_0.func.super_IString.str._M_str = local_c0;
    C2.type.id = (uintptr_t)local_1b8;
    if ((((curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id ==
          BinaryId) &&
        (BVar2 = curr->op, BVar8 = Abstract::getBinary((Type)(curr->left->type).id,Eq),
        BVar2 == BVar8)) &&
       (bVar6 = Match::Internal::
                Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                ::match(curr,(SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                              *)&C2.field_0.func.super_IString.str._M_str), bVar6))
    goto LAB_009eb40f;
    local_90 = (undefined1  [8])&local_40;
    zero.field_0.func.super_IString.str._M_str = (char *)&local_d8;
    local_d8.i64 = 0;
    zero.type.id = (uintptr_t)local_1c8;
    local_1c8 = (undefined1  [8])0x0;
    zero.field_0.i32 = 4;
    C1SubC2.type.id = (uintptr_t)local_138;
    C2.field_0.func.super_IString.str._M_str = (char *)0x0;
    local_138 = (undefined1  [8])0x0;
    local_170 = (undefined1  [8])0x0;
    C1SubC2.field_0.i32 = 0x15;
    C1SubC2.field_0.func.super_IString.str._M_str = local_90;
    if (((curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id == BinaryId
        ) && (BVar2 = curr->op, BVar8 = Abstract::getBinary((Type)(curr->left->type).id,Ne),
             BVar2 == BVar8)) {
      bVar7 = Match::Internal::
              Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
              ::match(curr,(SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                            *)&C1SubC2.field_0.func.super_IString.str._M_str);
      bVar6 = true;
      if (bVar7) goto LAB_009eb40f;
    }
    else {
      bVar6 = true;
    }
  }
LAB_009eb428:
  C2SubC1.type.id = (uintptr_t)local_1b8;
  local_1b8 = (undefined1  [8])&local_40;
  if (!bVar6) {
    return (Expression *)inner;
  }
  local_90 = (undefined1  [8])0x0;
  C1.field_0.func.super_IString.str._M_str = (char *)0x0;
  local_c0 = (undefined1  [8])local_1c8;
  C2SubC1.field_0.i32 = 3;
  C2SubC1.field_0.func.super_IString.str._M_str = local_90;
  local_150.next.curr =
       (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
        *)local_138;
  C2.field_0.func.super_IString.str._M_str = (char *)0x0;
  local_138 = (undefined1  [8])&local_68;
  local_170 = (undefined1  [8])0x0;
  C1SubC2.field_0.func.super_IString.str._M_str = (char *)0x0;
  local_150.curr =
       (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
        *)local_c0;
  if (((curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id == BinaryId)
     && (bVar6 = Match::Internal::
                 Components<wasm::Binary_*,_1,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                 ::match(curr,&local_150), bVar6)) {
    bVar7 = canOverflow(local_48,(Binary *)local_1c8,
                        (bool)((byte)(0x1540000aa0000 >> ((byte)curr->op & 0x3f)) &
                              curr->op < GeUInt64));
    bVar6 = true;
    if (!bVar7) {
      Literal::Literal((Literal *)local_1b8,(Literal *)(local_40.id + 0x10));
      Literal::Literal((Literal *)local_138,(Literal *)(local_68 + 0x10));
      Literal::sub((Literal *)local_170,(Literal *)local_1b8,(Literal *)local_138);
      Literal::sub((Literal *)local_c0,(Literal *)local_138,(Literal *)local_1b8);
      Literal::makeZero((Literal *)local_90,
                        (Type)(((SpecificExpression<(wasm::Expression::Id)16> *)local_1c8)->
                              super_Expression).type.id);
      bVar6 = Literal::operator!=((Literal *)local_1b8,(Literal *)local_90);
      if ((bVar6) && (bVar6 = Literal::operator!=((Literal *)local_138,(Literal *)local_90), bVar6))
      {
        if (((ulong)curr->op < 0x31) && ((0x1540000aa0000U >> ((ulong)curr->op & 0x3f) & 1) != 0)) {
          Literal::leS((Literal *)&c2,(Literal *)local_c0,(Literal *)local_138);
          iVar13 = Literal::getInteger((Literal *)&c2);
          if (iVar13 == 0) {
            bVar6 = false;
          }
          else {
            Literal::leS((Literal *)&local_f0.func,(Literal *)local_90,(Literal *)local_1b8);
            iVar13 = Literal::getInteger((Literal *)&local_f0.func);
            bVar6 = iVar13 != 0;
            Literal::~Literal((Literal *)&local_f0.func);
          }
          Literal::~Literal((Literal *)&c2);
          if (bVar6) {
            bVar6 = true;
            goto LAB_009eb775;
          }
          Literal::leS((Literal *)&c2,(Literal *)local_170,(Literal *)local_1b8);
          iVar13 = Literal::getInteger((Literal *)&c2);
          if (iVar13 == 0) {
            bVar7 = false;
          }
          else {
            Literal::leS((Literal *)&local_d8.func,(Literal *)local_90,(Literal *)local_138);
            iVar13 = Literal::getInteger((Literal *)&local_d8.func);
            bVar7 = iVar13 != 0;
            Literal::~Literal((Literal *)&local_d8.func);
          }
          Literal::~Literal((Literal *)&c2);
          bVar6 = false;
        }
        else {
          Literal::leU((Literal *)&c2,(Literal *)local_c0,(Literal *)local_138);
          iVar13 = Literal::getInteger((Literal *)&c2);
          if (iVar13 == 0) {
            bVar6 = false;
          }
          else {
            Literal::leU((Literal *)&local_f0.func,(Literal *)local_90,(Literal *)local_1b8);
            iVar13 = Literal::getInteger((Literal *)&local_f0.func);
            bVar6 = iVar13 != 0;
            Literal::~Literal((Literal *)&local_f0.func);
          }
          Literal::~Literal((Literal *)&c2);
          if (bVar6) {
            bVar6 = true;
            bVar7 = false;
          }
          else {
            Literal::leU((Literal *)&c2,(Literal *)local_170,(Literal *)local_1b8);
            iVar13 = Literal::getInteger((Literal *)&c2);
            if (iVar13 == 0) {
              bVar7 = false;
            }
            else {
              Literal::leU((Literal *)&local_d8.func,(Literal *)local_90,(Literal *)local_138);
              iVar13 = Literal::getInteger((Literal *)&local_d8.func);
              bVar7 = iVar13 != 0;
              Literal::~Literal((Literal *)&local_d8.func);
            }
            Literal::~Literal((Literal *)&c2);
            bVar6 = false;
          }
          if ((!bVar6) && (!bVar7)) {
            __assert_fail("doC2SubC1 || doC1SubC2",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                          ,0x1232,
                          "Expression *wasm::OptimizeInstructions::optimizeRelational(Binary *)");
          }
        }
      }
      else {
        bVar6 = false;
LAB_009eb775:
        bVar7 = false;
      }
      if (bVar6) {
        Literal::operator=((Literal *)(local_68 + 0x10),(Literal *)local_c0);
        curr->left = *(Expression **)((long)local_1c8 + 0x18);
LAB_009eb7d1:
        bVar6 = false;
        inner = curr;
      }
      else {
        bVar6 = true;
        if (bVar7) {
          Literal::operator=((Literal *)(local_40.id + 0x10),(Literal *)local_170);
          Literal::operator=((Literal *)(local_68 + 0x10),(Literal *)local_90);
          goto LAB_009eb7d1;
        }
      }
      Literal::~Literal((Literal *)local_90);
      Literal::~Literal((Literal *)local_c0);
      Literal::~Literal((Literal *)local_170);
      Literal::~Literal((Literal *)local_138);
      Literal::~Literal((Literal *)local_1b8);
    }
  }
  else {
    bVar6 = true;
  }
  if (!bVar6) {
    return (Expression *)inner;
  }
  IVar9 = Bits::getMaxBits<wasm::OptimizeInstructions>(curr->left,local_48);
  TVar4.id = (curr->left->type).id;
  uVar10 = 0xffffffff;
  local_1b8 = (undefined1  [8])TVar4.id;
  if (TVar4.id - 2 < 5) {
    uVar10 = wasm::Type::getByteSize((Type *)local_1b8);
    uVar10 = uVar10 << 3;
  }
  bVar6 = true;
  if (uVar10 <= IVar9) goto LAB_009eb75b;
  uVar10 = 0;
  if (curr->right->_id == ConstId) {
    uVar10 = Bits::getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                       (curr->right,(DummyLocalInfoProvider *)0x0);
  }
  uVar11 = 0xffffffff;
  local_1b8 = (undefined1  [8])TVar4.id;
  if (TVar4.id - 2 < 5) {
    uVar11 = wasm::Type::getByteSize((Type *)local_1b8);
    uVar11 = uVar11 << 3;
  }
  if (uVar10 <= IVar9) {
    bVar6 = true;
    goto LAB_009eb75b;
  }
  BVar2 = curr->op;
  BVar8 = Abstract::getBinary(TVar4,Eq);
  if ((((BVar2 == BVar8) ||
       (BVar2 = curr->op, BVar8 = Abstract::getBinary(TVar4,GtU), BVar2 == BVar8)) ||
      (BVar2 = curr->op, BVar8 = Abstract::getBinary(TVar4,GeU), BVar2 == BVar8)) ||
     ((uVar10 != uVar11 &&
      ((BVar2 = curr->op, BVar8 = Abstract::getBinary(TVar4,GtS), BVar2 == BVar8 ||
       (BVar2 = curr->op, BVar8 = Abstract::getBinary(TVar4,GeS), BVar2 == BVar8)))))) {
    __return_storage_ptr__ = &local_228;
    Literal::makeZero(__return_storage_ptr__,(Type)0x2);
    pBVar14 = (Binary *)
              getDroppedChildrenAndAppend(local_48,(Expression *)curr,__return_storage_ptr__);
  }
  else {
    BVar2 = curr->op;
    BVar8 = Abstract::getBinary(TVar4,Ne);
    if (((BVar2 != BVar8) &&
        (BVar2 = curr->op, BVar8 = Abstract::getBinary(TVar4,LtU), BVar2 != BVar8)) &&
       (BVar2 = curr->op, BVar8 = Abstract::getBinary(TVar4,LeU), BVar2 != BVar8)) {
      BVar2 = curr->op;
      if (uVar10 == uVar11) {
        BVar8 = Abstract::getBinary(TVar4,GtS);
        if ((BVar2 == BVar8) ||
           (BVar2 = curr->op, BVar8 = Abstract::getBinary(TVar4,GeS), BVar2 == BVar8)) {
          __return_storage_ptr__ = &local_1f8;
          Literal::makeOne(__return_storage_ptr__,(Type)0x2);
          pBVar14 = (Binary *)
                    getDroppedChildrenAndAppend(local_48,(Expression *)curr,__return_storage_ptr__);
        }
        else {
          BVar2 = curr->op;
          BVar8 = Abstract::getBinary(TVar4,LtS);
          if (BVar2 != BVar8) {
            BVar2 = curr->op;
            BVar8 = Abstract::getBinary(TVar4,LeS);
            bVar6 = true;
            if (BVar2 != BVar8) goto LAB_009eb75b;
          }
          __return_storage_ptr__ = &local_1e0;
          Literal::makeZero(__return_storage_ptr__,(Type)0x2);
          pBVar14 = (Binary *)
                    getDroppedChildrenAndAppend(local_48,(Expression *)curr,__return_storage_ptr__);
        }
        goto LAB_009eb737;
      }
      BVar8 = Abstract::getBinary(TVar4,LtS);
      if (BVar2 != BVar8) {
        BVar2 = curr->op;
        BVar8 = Abstract::getBinary(TVar4,LeS);
        bVar6 = true;
        if (BVar2 != BVar8) goto LAB_009eb75b;
      }
    }
    __return_storage_ptr__ = &local_210;
    Literal::makeOne(__return_storage_ptr__,(Type)0x2);
    pBVar14 = (Binary *)
              getDroppedChildrenAndAppend(local_48,(Expression *)curr,__return_storage_ptr__);
  }
LAB_009eb737:
  Literal::~Literal(__return_storage_ptr__);
  bVar6 = false;
  inner = pBVar14;
LAB_009eb75b:
  if (bVar6) {
    return (Expression *)0x0;
  }
  return (Expression *)inner;
}

Assistant:

Expression* optimizeRelational(Binary* curr) {
    using namespace Abstract;
    using namespace Match;

    auto type = curr->right->type;
    if (curr->left->type.isInteger()) {
      if (curr->op == Abstract::getBinary(type, Abstract::Eq) ||
          curr->op == Abstract::getBinary(type, Abstract::Ne)) {
        if (auto* left = curr->left->dynCast<Binary>()) {
          // TODO: inequalities can also work, if the constants do not overflow
          // integer math, even on 2s complement, allows stuff like
          // x + 5 == 7
          //   =>
          //     x == 2
          if (left->op == Abstract::getBinary(type, Abstract::Add)) {
            if (auto* leftConst = left->right->dynCast<Const>()) {
              if (auto* rightConst = curr->right->dynCast<Const>()) {
                return combineRelationalConstants(
                  curr, left, leftConst, nullptr, rightConst);
              } else if (auto* rightBinary = curr->right->dynCast<Binary>()) {
                if (rightBinary->op ==
                    Abstract::getBinary(type, Abstract::Add)) {
                  if (auto* rightConst = rightBinary->right->dynCast<Const>()) {
                    return combineRelationalConstants(
                      curr, left, leftConst, rightBinary, rightConst);
                  }
                }
              }
            }
          }
        }
      }
      // x - y == 0  =>  x == y
      // x - y != 0  =>  x != y
      // unsigned(x - y) > 0    =>   x != y
      // unsigned(x - y) <= 0   =>   x == y
      {
        Binary* inner;
        // unsigned(x - y) > 0    =>   x != y
        if (matches(curr,
                    binary(GtU, binary(&inner, Sub, any(), any()), ival(0)))) {
          curr->op = Abstract::getBinary(type, Ne);
          curr->right = inner->right;
          curr->left = inner->left;
          return curr;
        }
        // unsigned(x - y) <= 0   =>   x == y
        if (matches(curr,
                    binary(LeU, binary(&inner, Sub, any(), any()), ival(0)))) {
          curr->op = Abstract::getBinary(type, Eq);
          curr->right = inner->right;
          curr->left = inner->left;
          return curr;
        }
        // x - y == 0  =>  x == y
        // x - y != 0  =>  x != y
        // This is not true for signed comparisons like x -y < 0 due to overflow
        // effects (e.g. 8 - 0x80000000 < 0 is not the same as 8 < 0x80000000).
        if (matches(curr,
                    binary(Eq, binary(&inner, Sub, any(), any()), ival(0))) ||
            matches(curr,
                    binary(Ne, binary(&inner, Sub, any(), any()), ival(0)))) {
          curr->right = inner->right;
          curr->left = inner->left;
          return curr;
        }
      }

      // x + C1 > C2   ==>  x > (C2-C1)      if no overflowing, C2 >= C1
      // x + C1 > C2   ==>  x + (C1-C2) > 0  if no overflowing, C2 <  C1
      // And similarly for other relational operations on integers with a "+"
      // on the left.
      // TODO: support - and not just +
      {
        Binary* add;
        Const* c1;
        Const* c2;
        if (matches(curr,
                    binary(binary(&add, Add, any(), ival(&c1)), ival(&c2))) &&
            !canOverflow(add, isSignedOp(curr->op))) {
          // We want to subtract C2-C1 or C1-C2. When doing so, we must avoid an
          // overflow in that subtraction (so that we keep all the math here
          // properly linear in the mathematical sense). Overflows that concern
          // us include an underflow with unsigned values (e.g. 10 - 20, which
          // flips the result to a large positive number), and a sign bit
          // overflow for signed values (e.g. 0x80000000 - 1 = 0x7fffffff flips
          // from a negative number, -1, to a positive one). We also need to be
          // careful of signed handling of 0x80000000, for whom 0 - 0x80000000
          // is equal to 0x80000000, leading to
          //   x + 0x80000000 > 0                ;; always false
          // (apply the rule)
          //   x > 0 - 0x80000000 = 0x80000000   ;; depends on x
          // The general principle in all of this is that when we go from
          //   (a)    x + C1 > C2
          // to
          //   (b)    x      > (C2-C1)
          // then we want to adjust both sides in the same (linear) manner. That
          // is, we can write the latter as
          //   (b')   x + 0  > (C2-C1)
          // Comparing (a) and (b'), we want the constants to change in a
          // consistent way: C1 changes to 0, and C2 changes to C2-C1. Both
          // transformations should decrease the value, which is violated in all
          // the overflows described above:
          //   * Unsigned overflow: C1=20, C2=10, then C1 decreases but C2-C1
          //     is larger than C2.
          //   * Sign flip: C1=1, C2=0x80000000, then C1 decreases but C2-C1 is
          //     is larger than C2.
          //   * C1=0x80000000, C2=0, then C1 increases while C2-C1 stays the
          //     same.
          // In the first and second case we can apply the other rule using
          // C1-C2 rather than C2-C1. The third case, however, doesn't even work
          // that way.
          auto C1 = c1->value;
          auto C2 = c2->value;
          auto C1SubC2 = C1.sub(C2);
          auto C2SubC1 = C2.sub(C1);
          auto zero = Literal::makeZero(add->type);
          auto doC1SubC2 = false;
          auto doC2SubC1 = false;
          // Ignore the case of C1 or C2 being zero, as then C2-C1 or C1-C2
          // does not change anything (and we don't want the optimizer to think
          // we improved anything, or we could infinite loop on the mirage of
          // progress).
          if (C1 != zero && C2 != zero) {
            if (isSignedOp(curr->op)) {
              if (C2SubC1.leS(C2).getInteger() && zero.leS(C1).getInteger()) {
                // C2=>C2-C1 and C1=>0 both decrease, which means we can do the
                // rule
                //   (a)    x + C1   > C2
                //   (b')   x (+ 0)  > (C2-C1)
                // That is, subtracting C1 from both sides is ok; the constants
                // on both sides change in the same manner.
                doC2SubC1 = true;
              } else if (C1SubC2.leS(C1).getInteger() &&
                         zero.leS(C2).getInteger()) {
                // N.B. this code path is not tested atm as other optimizations
                // will canonicalize x + C into x - C, and so we would need to
                // implement the TODO above on subtraction and not only support
                // addition here.
                doC1SubC2 = true;
              }
            } else {
              // Unsigned.
              if (C2SubC1.leU(C2).getInteger() && zero.leU(C1).getInteger()) {
                doC2SubC1 = true;
              } else if (C1SubC2.leU(C1).getInteger() &&
                         zero.leU(C2).getInteger()) {
                doC1SubC2 = true;
              }
              // For unsigned, one of the cases must work out, as there are no
              // corner cases with the sign bit.
              assert(doC2SubC1 || doC1SubC2);
            }
          }
          if (doC2SubC1) {
            // This is the first line above, we turn into x > (C2-C1).
            c2->value = C2SubC1;
            curr->left = add->left;
            return curr;
          }
          // This is the second line above, we turn into x + (C1-C2) > 0.
          if (doC1SubC2) {
            c1->value = C1SubC2;
            c2->value = zero;
            return curr;
          }
        }
      }

      // Comparisons can sometimes be simplified depending on the number of
      // bits, e.g.  (unsigned)x > y  must be true if x has strictly more bits.
      // A common case is a constant on the right, e.g. (x & 255) < 256 must be
      // true.
      // TODO: use getMinBits in more places, see ideas in
      //       https://github.com/WebAssembly/binaryen/issues/2898
      {
        // Check if there is a nontrivial amount of bits on the left, which may
        // provide enough to optimize.
        auto leftMaxBits = Bits::getMaxBits(curr->left, this);
        auto type = curr->left->type;
        if (leftMaxBits < getBitsForType(type)) {
          using namespace Abstract;
          auto rightMinBits = Bits::getMinBits(curr->right);
          auto rightIsNegative = rightMinBits == getBitsForType(type);
          if (leftMaxBits < rightMinBits) {
            // There are not enough bits on the left for it to be equal to the
            // right, making various comparisons obviously false:
            //             x == y
            //   (unsigned)x >  y
            //   (unsigned)x >= y
            // and the same for signed, if y does not have the sign bit set
            // (in that case, the comparison is effectively unsigned).
            //
            // TODO: In addition to leftMaxBits < rightMinBits, we could
            //       handle the reverse, and also special cases like all bits
            //       being 1 on the right, things like (x & 255) <= 255  ->  1
            if (curr->op == Abstract::getBinary(type, Eq) ||
                curr->op == Abstract::getBinary(type, GtU) ||
                curr->op == Abstract::getBinary(type, GeU) ||
                (!rightIsNegative &&
                 (curr->op == Abstract::getBinary(type, GtS) ||
                  curr->op == Abstract::getBinary(type, GeS)))) {
              return getDroppedChildrenAndAppend(curr,
                                                 Literal::makeZero(Type::i32));
            }

            // And some are obviously true:
            //             x != y
            //   (unsigned)x <  y
            //   (unsigned)x <= y
            // and likewise for signed, as above.
            if (curr->op == Abstract::getBinary(type, Ne) ||
                curr->op == Abstract::getBinary(type, LtU) ||
                curr->op == Abstract::getBinary(type, LeU) ||
                (!rightIsNegative &&
                 (curr->op == Abstract::getBinary(type, LtS) ||
                  curr->op == Abstract::getBinary(type, LeS)))) {
              return getDroppedChildrenAndAppend(curr,
                                                 Literal::makeOne(Type::i32));
            }

            // For truly signed comparisons, where y's sign bit is set, we can
            // also infer some things, since we know y is signed but x is not
            // (since x does not have enough bits for the sign bit to be set).
            if (rightIsNegative) {
              //   (signed, non-negative)x >  (negative)y   =>   1
              //   (signed, non-negative)x >= (negative)y   =>   1
              if (curr->op == Abstract::getBinary(type, GtS) ||
                  curr->op == Abstract::getBinary(type, GeS)) {
                return getDroppedChildrenAndAppend(curr,
                                                   Literal::makeOne(Type::i32));
              }
              //   (signed, non-negative)x <  (negative)y   =>   0
              //   (signed, non-negative)x <= (negative)y   =>   0
              if (curr->op == Abstract::getBinary(type, LtS) ||
                  curr->op == Abstract::getBinary(type, LeS)) {
                return getDroppedChildrenAndAppend(
                  curr, Literal::makeZero(Type::i32));
              }
            }
          }
        }
      }
    }
    return nullptr;
  }